

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver.cpp
# Opt level: O3

int __thiscall QLocalServer::listen(QLocalServer *this,int __fd,int __n)

{
  QLocalServerPrivate *this_00;
  char16_t *pcVar1;
  qsizetype qVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  int iVar5;
  undefined8 uVar6;
  QLocalServerPrivate *d;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QAnyStringView QVar8;
  QArrayData *local_70 [3];
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLocalServerPrivate **)&this->field_0x8;
  if ((this_00->serverName).d.size == 0) {
    if (*(long *)((QString *)CONCAT44(in_register_00000034,__fd) + 0x10) == 0) {
      this_00->error = HostNotFoundError;
      QVar7.m_data = &DAT_00000014;
      QVar7.m_size = (qsizetype)&local_58;
      QString::fromLatin1(QVar7);
      qVar2 = local_48;
      pcVar1 = pcStack_50;
      pQVar4 = local_58;
      QMetaObject::tr((char *)local_70,(char *)&staticMetaObject,0x27ca95);
      QVar8.m_size = (size_t)local_70;
      QVar8.field_0.m_data = &local_58;
      QString::arg_impl(QVar8,(int)pcVar1,(QChar)(char16_t)qVar2);
      pQVar3 = &((this_00->errorString).d.d)->super_QArrayData;
      pcVar1 = (this_00->errorString).d.ptr;
      (this_00->errorString).d.d = (Data *)local_58;
      (this_00->errorString).d.ptr = pcStack_50;
      qVar2 = (this_00->errorString).d.size;
      (this_00->errorString).d.size = local_48;
      local_58 = pQVar3;
      pcStack_50 = pcVar1;
      local_48 = qVar2;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
      if (local_70[0] != (QArrayData *)0x0) {
        LOCK();
        (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_70[0],2,0x10);
        }
      }
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        iVar5 = (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
joined_r0x0023ed33:
        if (iVar5 == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
    else {
      iVar5 = QLocalServerPrivate::listen(this_00,__fd,__n);
      if ((char)iVar5 != '\0') {
        uVar6 = QString::operator=(&this_00->serverName,
                                   (QString *)CONCAT44(in_register_00000034,__fd));
        iVar5 = (int)CONCAT71((int7)((ulong)uVar6 >> 8),1);
        goto LAB_0023edcf;
      }
      if ((this_00->serverName).d.ptr != (char16_t *)0x0) {
        pQVar3 = &((this_00->serverName).d.d)->super_QArrayData;
        (this_00->serverName).d.d = (Data *)0x0;
        (this_00->serverName).d.ptr = (char16_t *)0x0;
        (this_00->serverName).d.size = 0;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,2,0x10);
          }
        }
      }
      if ((this_00->fullServerName).d.ptr != (char16_t *)0x0) {
        pQVar4 = &((this_00->fullServerName).d.d)->super_QArrayData;
        (this_00->fullServerName).d.d = (Data *)0x0;
        (this_00->fullServerName).d.ptr = (char16_t *)0x0;
        (this_00->fullServerName).d.size = 0;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          iVar5 = (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          goto joined_r0x0023ed33;
        }
      }
    }
  }
  else {
    listen((int)this,__fd);
  }
  iVar5 = 0;
LAB_0023edcf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QLocalServer::listen(const QString &name)
{
    Q_D(QLocalServer);
    if (isListening()) {
        qWarning("QLocalServer::listen() called when already listening");
        return false;
    }

    if (name.isEmpty()) {
        d->error = QAbstractSocket::HostNotFoundError;
        QString function = "QLocalServer::listen"_L1;
        d->errorString = tr("%1: Name error").arg(function);
        return false;
    }

    if (!d->listen(name)) {
        d->serverName.clear();
        d->fullServerName.clear();
        return false;
    }

    d->serverName = name;
    return true;
}